

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O3

size_t __thiscall mir::inst::MirFunction::variable_table_size(MirFunction *this)

{
  long lVar1;
  _Rb_tree_node_base *p_Var2;
  size_t sVar3;
  
  sVar3 = 0;
  for (p_Var2 = (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->variables)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    lVar1 = (**(code **)(*(long *)p_Var2[1]._M_left + 0x18))();
    sVar3 = sVar3 + ((long)(int)lVar1 & (lVar1 << 0x1f) >> 0x3f);
  }
  return sVar3;
}

Assistant:

size_t MirFunction::variable_table_size() const {
  size_t size = 0;
  for (auto& v : variables) {
    auto s = v.second.ty->size();
    if (s) size += s.value();
  }
  return size;
}